

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.hpp
# Opt level: O0

int __thiscall
cpprofiler::Connector::connect(Connector *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  int rv;
  addrinfo *p;
  addrinfo *servinfo;
  addrinfo hints;
  string local_70 [12];
  uint in_stack_ffffffffffffff9c;
  addrinfo *local_48;
  addrinfo *local_40;
  addrinfo local_38;
  Connector *local_8;
  
  local_38.ai_canonname = (char *)0x0;
  local_38.ai_next = (addrinfo *)0x0;
  local_38.ai_addrlen = 0;
  local_38._20_4_ = 0;
  local_38.ai_addr = (sockaddr *)0x0;
  local_38.ai_flags = 0;
  local_38.ai_family = 0;
  local_38.ai_socktype = 1;
  local_38.ai_protocol = 0;
  local_8 = this;
  std::__cxx11::to_string(in_stack_ffffffffffffff9c);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = getaddrinfo("localhost",pcVar2,&local_38,&local_40);
  std::__cxx11::string::~string(local_70);
  if (iVar1 == 0) {
    for (local_48 = local_40; local_48 != (addrinfo *)0x0; local_48 = local_48->ai_next) {
      iVar1 = socket(local_48->ai_family,local_48->ai_socktype,local_48->ai_protocol);
      this->sockfd = iVar1;
      if (iVar1 != -1) {
        iVar1 = ::connect(this->sockfd,local_48->ai_addr,local_48->ai_addrlen);
        if (iVar1 != -1) break;
        close(this->sockfd);
      }
    }
    if (local_48 != (addrinfo *)0x0) {
      freeaddrinfo(local_40);
      this->_connected = true;
      goto LAB_00288233;
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"getaddrinfo: ");
    pcVar2 = gai_strerror(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar2);
    std::operator<<(poVar3,"\n");
  }
  this->_connected = false;
LAB_00288233:
  return (int)this;
}

Assistant:

void connect() {
    struct addrinfo hints, *servinfo, *p;
    int rv;

#ifdef WIN32
    // Initialise Winsock.
    WSADATA wsaData;
    int startupResult = WSAStartup(MAKEWORD(2, 2), &wsaData);
    if (startupResult != 0) {
      printf("WSAStartup failed with error: %d\n", startupResult);
    }
#endif

    memset(&hints, 0, sizeof hints);
    hints.ai_family = AF_UNSPEC;
    hints.ai_socktype = SOCK_STREAM;

    if ((rv = getaddrinfo("localhost", std::to_string(port).c_str(), &hints,
                          &servinfo)) != 0) {
      std::cerr << "getaddrinfo: " << gai_strerror(rv) << "\n";
      goto giveup;
    }

    // loop through all the results and connect to the first we can
    for (p = servinfo; p != NULL; p = p->ai_next) {
      if ((sockfd = socket(p->ai_family, p->ai_socktype, p->ai_protocol)) == -1) {
        // errno is set here, but we don't examine it.
        continue;
      }

      if (::connect(sockfd, p->ai_addr, p->ai_addrlen) == -1) {
#ifdef WIN32
        closesocket(sockfd);
#else
        close(sockfd);
#endif
        // errno is set here, but we don't examine it.
        continue;
      }

      break;
    }

    // Connection failed; give up.
    if (p == NULL) {
      goto giveup;
    }

    freeaddrinfo(servinfo);  // all done with this structure

    _connected = true;

    return;
giveup:
    _connected = false;
    return;

  }